

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_snap_functions.cc
# Opt level: O3

S1Angle __thiscall
s2builderutil::IntLatLngSnapFunction::min_edge_vertex_separation(IntLatLngSnapFunction *this)

{
  double dVar1;
  double extraout_XMM0_Qa;
  S1Angle SVar2;
  double dVar3;
  double dVar4;
  
  (*(this->super_SnapFunction)._vptr_SnapFunction[3])();
  dVar1 = (this->snap_radius_).radians_;
  dVar4 = this->to_degrees_ * 0.017453292519943295 * 0.277;
  dVar3 = dVar1 * 0.222;
  SVar2.radians_ = extraout_XMM0_Qa * (extraout_XMM0_Qa / dVar1) * 0.5;
  if (SVar2.radians_ <= dVar3) {
    SVar2.radians_ = dVar3;
  }
  if (SVar2.radians_ <= dVar4) {
    SVar2.radians_ = dVar4;
  }
  return (S1Angle)SVar2.radians_;
}

Assistant:

S1Angle IntLatLngSnapFunction::min_edge_vertex_separation() const {
  // Similar to min_vertex_separation(), in this case we have three bounds:
  // one is a constant bound, one is proportional to snap_radius, and one is
  // equal to snap_radius minus a constant.
  //
  // 1. Constant bound: In the plane, the worst-case configuration has an
  //    edge-vertex separation of ((1 / sqrt(13)) * to_degrees_) degrees.
  //    The unit test verifies this, except that on the sphere the ratio is
  //    slightly lower when small exponents such as E1 are used
  //    (0.2772589 vs 0.2773501).
  //
  // 2. Proportional bound: In the plane, the worst-case configuration has an
  //    edge-vertex separation of (2 / 9) * snap_radius (0.222222222222).  The
  //    unit test verifies this, except that on the sphere the bound can be
  //    slightly worse with large exponents (e.g., E9) due to small numerical
  //    errors (0.222222126756717).
  //
  // 3. Best asymptotic bound: If snap_radius() is large compared to the
  //    minimum snap radius, then the best bound is achieved by 3 sites on a
  //    circular arc of radius "snap_radius", spaced "min_vertex_separation"
  //    apart (see S2CellIdSnapFunction::min_edge_vertex_separation).  This
  //    bound approaches 0.5 * snap_radius as the snap radius becomes large
  //    relative to the grid spacing.

  S1Angle vertex_sep = min_vertex_separation();
  return max(0.277 * S1Angle::Degrees(to_degrees_),  // 1/sqrt(13) in the plane
             max(0.222 * snap_radius_,               // 2/9 in the plane
                 0.5 * (vertex_sep / snap_radius_) * vertex_sep));
}